

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

void __thiscall
pbrt::PortalImageInfiniteLight::PDF_Le
          (PortalImageInfiniteLight *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  Point2<float> *p;
  Float FVar1;
  undefined1 auVar2 [16];
  Vector3<float> VVar3;
  Vector3f wRender;
  Float duv_dw;
  optional<pbrt::Point2<float>_> uv;
  Bounds2f b;
  float local_50;
  undefined1 local_4c [12];
  Tuple2<pbrt::Point2,_float> local_40;
  Tuple2<pbrt::Point2,_float> local_38;
  Bounds2<float> local_30;
  
  VVar3 = Normalize<float>(&ray->d);
  wRender.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
       VVar3.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
  wRender.super_Tuple3<pbrt::Vector3,_float>.z = -VVar3.super_Tuple3<pbrt::Vector3,_float>.z;
  ImageFromRender((PortalImageInfiniteLight *)local_4c,wRender,(Float *)this);
  if ((local_4c[8] == true) && ((local_50 != 0.0 || (NAN(local_50))))) {
    auVar2._8_4_ = 0x3f800000;
    auVar2._0_8_ = 0x3f8000003f800000;
    auVar2._12_4_ = 0x3f800000;
    local_38.x = 0.0;
    local_38.y = 0.0;
    local_40 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar2);
    Bounds2<float>::Bounds2(&local_30,(Point2<float> *)&local_38,(Point2<float> *)&local_40);
    p = pstd::optional<pbrt::Point2<float>_>::value((optional<pbrt::Point2<float>_> *)local_4c);
    FVar1 = WindowedPiecewiseConstant2D::PDF(&this->distribution,p,&local_30);
    *pdfPos = 1.0 / (this->sceneRadius * this->sceneRadius * 3.1415927);
    *pdfDir = FVar1 / local_50;
  }
  else {
    *pdfDir = 0.0;
    *pdfPos = 0.0;
  }
  pstd::optional<pbrt::Point2<float>_>::~optional((optional<pbrt::Point2<float>_> *)local_4c);
  return;
}

Assistant:

void PortalImageInfiniteLight::PDF_Le(const Ray &ray, Float *pdfPos,
                                      Float *pdfDir) const {
    // TODO: negate here or???
    Vector3f w = -Normalize(ray.d);
    Float duv_dw;
    pstd::optional<Point2f> uv = ImageFromRender(w, &duv_dw);

    if (!uv || duv_dw == 0) {
        *pdfPos = *pdfDir = 0;
        return;
    }

    Bounds2f b(Point2f(0, 0), Point2f(1, 1));
    Float pdf = distribution.PDF(*uv, b);

#if 0
    Normal3f n = Normal3f(portalFrame.z);
    *pdfPos = 1 / (Area() * AbsDot(n, w));
#else
    *pdfPos = 1 / (Pi * Sqr(sceneRadius));
#endif

    *pdfDir = pdf / duv_dw;
}